

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage.cc
# Opt level: O1

bool __thiscall
tinyusdz::Stage::find_prim_from_relative_path
          (Stage *this,Prim *root,Path *relative_path,Prim **prim,string *err)

{
  bool bVar1;
  expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret;
  undefined1 local_40 [32];
  bool local_20;
  
  GetPrimFromRelativePath_abi_cxx11_
            ((expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_40,(Stage *)root,(Prim *)relative_path,relative_path);
  bVar1 = local_20;
  if (local_20 == true) {
    *prim = (Prim *)local_40._0_8_;
  }
  else if (err != (string *)0x0) {
    std::__cxx11::string::_M_assign((string *)err);
  }
  if ((local_20 == false) && ((Prim *)local_40._0_8_ != (Prim *)(local_40 + 0x10))) {
    operator_delete((void *)local_40._0_8_,local_40._16_8_ + 1);
  }
  return bVar1;
}

Assistant:

bool Stage::find_prim_from_relative_path(const Prim &root,
                                         const Path &relative_path,
                                         const Prim *&prim,
                                         std::string *err) const {
  nonstd::expected<const Prim *, std::string> ret =
      GetPrimFromRelativePath(root, relative_path);
  if (ret) {
    prim = ret.value();
    return true;
  } else {
    if (err) {
      (*err) = ret.error();
    }
    return false;
  }
}